

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastSquare(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int Entry;
  Vec_Wec_t *vProds_00;
  Vec_Wec_t *vLevels_00;
  int local_48;
  int local_44;
  int k;
  int i;
  Vec_Wec_t *vLevels;
  Vec_Wec_t *vProds;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vTmp_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  vProds_00 = Vec_WecStart(nNum << 1);
  vLevels_00 = Vec_WecStart(nNum << 1);
  for (local_44 = 0; local_44 < nNum; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < nNum; local_48 = local_48 + 1) {
      if (local_44 == local_48) {
        Vec_WecPush(vProds_00,local_44 + local_48,pNum[local_44]);
        Vec_WecPush(vLevels_00,local_44 + local_48,0);
      }
      else if (local_44 < local_48) {
        Entry = Gia_ManHashAnd(pNew,pNum[local_44],pNum[local_48]);
        Vec_WecPush(vProds_00,local_44 + local_48 + 1,Entry);
        Vec_WecPush(vLevels_00,local_44 + local_48 + 1,0);
      }
    }
  }
  Wlc_BlastReduceMatrix(pNew,vProds_00,vLevels_00,vRes,0,0);
  Vec_WecFree(vProds_00);
  Vec_WecFree(vLevels_00);
  return;
}

Assistant:

void Wlc_BlastSquare( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( 2*nNum );
    Vec_Wec_t * vLevels = Vec_WecStart( 2*nNum );
    int i, k;
    for ( i = 0; i < nNum; i++ )
        for ( k = 0; k < nNum; k++ )
        {
            if ( i == k )
            {
                Vec_WecPush( vProds,  i+k, pNum[i] );
                Vec_WecPush( vLevels, i+k, 0 );
            }
            else if ( i < k )
            {
                Vec_WecPush( vProds,  i+k+1, Gia_ManHashAnd(pNew, pNum[i], pNum[k]) );
                Vec_WecPush( vLevels, i+k+1, 0 );
            }
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, 0, 0 );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}